

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_addmul_v_s256_30_192(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  word in_stack_000001c8;
  mzd_local_t *in_stack_000001d0;
  mzd_local_t *in_stack_000001d8;
  
  mzd_addmul_v_s256_30_256_idx(in_stack_000001d8,in_stack_000001d0,in_stack_000001c8);
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_addmul_v_s256_30_192(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  mzd_addmul_v_s256_30_256_idx(c, A, CONST_BLOCK(v, 0)->w64[2] >> 34);
}